

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

action Search::search_predict
                 (search_private *priv,example *ecs,size_t ec_cnt,ptag mytag,action *oracle_actions,
                 size_t oracle_actions_cnt,ptag *condition_on,char *condition_on_names,
                 action *allowed_actions,size_t allowed_actions_cnt,float *allowed_actions_cost,
                 size_t learner_id,float *a_cost,float param_14)

{
  uint uVar1;
  action_repr item;
  bool bVar2;
  action aVar3;
  uint uVar4;
  ulong i_00;
  scored_action *psVar5;
  example **ppeVar6;
  uint **ppuVar7;
  uint *puVar8;
  size_t sVar9;
  action_repr *paVar10;
  char *pcVar11;
  char **ppcVar12;
  v_array<Search::action_cache> **ppvVar13;
  action_cache *paVar14;
  ostream *poVar15;
  exception *peVar16;
  ptag *ppVar17;
  undefined4 in_ECX;
  action *in_RDX;
  polylabel *in_RSI;
  search_private *in_RDI;
  float *in_R8;
  example *in_R9;
  undefined4 in_XMM0_Da;
  search_private *in_stack_00000008;
  action_repr *in_stack_00000010;
  action *in_stack_00000018;
  action *in_stack_00000020;
  example *in_stack_00000028;
  example *in_stack_00000030;
  example *in_stack_00000038;
  stringstream __msg;
  size_t n_1;
  size_t old_learner_id;
  size_t i_3;
  size_t kk;
  size_t n;
  size_t start_K;
  bool not_test;
  size_t i_2;
  int learner;
  bool need_fea;
  bool skip;
  bool gte_here;
  action a_4;
  int policy;
  action a_3;
  action a_name;
  size_t i_1;
  size_t i;
  _func_void_void_ptr_void_ptr *label_copy_fn;
  size_t label_size;
  action a_2;
  size_t valid_action_cnt;
  action a_1;
  action a;
  size_t t;
  size_t condition_on_cnt;
  example *in_stack_fffffffffffffb48;
  example *in_stack_fffffffffffffb50;
  example *in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  example *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  undefined8 in_stack_fffffffffffffb78;
  features *in_stack_fffffffffffffb80;
  undefined8 in_stack_fffffffffffffb88;
  undefined1 do_store;
  search_private *psVar18;
  undefined4 in_stack_fffffffffffffb90;
  action in_stack_fffffffffffffb94;
  action_repr *in_stack_fffffffffffffb98;
  search_private *in_stack_fffffffffffffba0;
  ptag *in_stack_fffffffffffffba8;
  ulong in_stack_fffffffffffffbb0;
  ptag mytag_00;
  undefined4 in_stack_fffffffffffffbb8;
  action in_stack_fffffffffffffbbc;
  polylabel *in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd4;
  action *in_stack_fffffffffffffbd8;
  action *in_stack_fffffffffffffbe0;
  example *in_stack_fffffffffffffbe8;
  example *in_stack_fffffffffffffbf0;
  action local_408;
  search_private *in_stack_fffffffffffffc00;
  polylabel *in_stack_fffffffffffffc08;
  example *in_stack_fffffffffffffc48;
  action_repr *in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  uint in_stack_fffffffffffffc5c;
  search_private *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  search_private *in_stack_fffffffffffffc70;
  size_t in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  undefined5 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc95;
  byte in_stack_fffffffffffffc96;
  undefined1 in_stack_fffffffffffffc97;
  byte bVar19;
  action local_368;
  action local_364;
  action local_360;
  action local_35c;
  undefined *local_328;
  action *local_320;
  action *local_318;
  example *local_310;
  float in_stack_fffffffffffffcfc;
  undefined1 in_stack_fffffffffffffd03;
  float in_stack_fffffffffffffd04;
  polylabel *in_stack_fffffffffffffd08;
  search_private *in_stack_fffffffffffffd10;
  stringstream local_2e0 [16];
  stringstream local_2d0 [7];
  undefined1 in_stack_fffffffffffffd37;
  search_private *in_stack_fffffffffffffd38;
  scored_action local_158;
  action *local_150;
  size_t local_148;
  ptag *local_140;
  ulong local_138;
  action *local_130;
  action *local_128;
  byte local_119;
  action_repr local_118;
  example *local_108;
  int local_100;
  byte local_f9;
  undefined8 local_f8;
  byte local_ee;
  byte local_ed;
  undefined1 local_ec [36];
  string local_c8 [32];
  action_repr local_a8;
  example *local_98;
  action *local_90;
  undefined *local_88;
  undefined8 local_80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  example *peVar20;
  undefined4 in_stack_ffffffffffffffb0;
  action in_stack_ffffffffffffffc8;
  
  if (in_stack_00000010 == (action_repr *)0x0) {
    local_310 = (example *)0x0;
  }
  else {
    local_310 = (example *)strlen((char *)in_stack_00000010);
  }
  i_00 = in_RDI->t + in_RDI->meta_t;
  in_RDI->t = in_RDI->t + 1;
  if ((in_RDI->state == GET_TRUTH_STRING) || ((in_RDI->force_oracle & 1U) != 0)) {
    aVar3 = choose_oracle_action
                      ((search_private *)
                       CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                       in_stack_fffffffffffffc78,(action *)in_stack_fffffffffffffc70,
                       CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                       (action *)in_stack_fffffffffffffc60,
                       CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                       (float *)CONCAT17(in_stack_fffffffffffffc97,
                                         CONCAT16(in_stack_fffffffffffffc96,
                                                  CONCAT15(in_stack_fffffffffffffc95,
                                                           in_stack_fffffffffffffc90))));
    *(float *)&(in_stack_00000038->super_example_predict).indices._begin = 0.0;
    return aVar3;
  }
  if ((in_RDI->state == LEARN) && (i_00 < in_RDI->learn_t)) {
    psVar5 = v_array<Search::scored_action>::operator[](&in_RDI->train_trajectory,i_00);
    aVar3 = psVar5->a;
    psVar5 = v_array<Search::scored_action>::operator[](&in_RDI->train_trajectory,i_00);
    *(float *)&(in_stack_00000038->super_example_predict).indices._begin = psVar5->s;
    if ((in_RDI->metaoverride != (BaseTask *)0x0) &&
       (in_RDI->metaoverride->_foreach_action !=
        (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)) {
      foreach_action_from_cache
                (in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98,
                 in_stack_fffffffffffffb94);
    }
    if (in_RDI->metaoverride == (BaseTask *)0x0) {
      return aVar3;
    }
    if (in_RDI->metaoverride->_post_prediction == (_func_void_search_ptr_size_t_action_float *)0x0)
    {
      return aVar3;
    }
    (*in_RDI->metaoverride->_post_prediction)
              (in_RDI->metaoverride->sch,i_00 - in_RDI->meta_t,aVar3,
               *(float *)&(in_stack_00000038->super_example_predict).indices._begin);
    return aVar3;
  }
  local_318 = in_RDX;
  if ((in_RDI->is_ldf & 1U) == 0) {
    if (in_stack_00000020 == (action *)0x0) {
      local_320 = (action *)in_RDI->A;
    }
    else {
      local_320 = in_stack_00000020;
    }
    local_318 = local_320;
  }
  if ((in_RDI->state == LEARN) && (i_00 == in_RDI->learn_t)) {
    uVar4 = (uint)in_RDI->learn_a_idx;
    in_RDI->loss_declared_cnt = 0;
    in_RDI->learn_a_idx = in_RDI->learn_a_idx + 1;
    if (local_318 <= (action *)in_RDI->learn_a_idx) {
      in_RDI->done_with_all_actions = true;
      in_RDI->learn_learner_id = (size_t)in_stack_00000030;
      if (in_R9 != (example *)0x0) {
        in_RDI->learn_oracle_action = (action)*in_R8;
      }
      in_RDI->learn_ec_ref_cnt = (size_t)in_RDX;
      if ((in_RDI->examples_dont_change & 1U) == 0) {
        local_80 = 8;
        if ((in_RDI->is_ldf & 1U) != 0) {
          local_80 = 0x20;
        }
        if ((in_RDI->is_ldf & 1U) == 0) {
          local_328 = (undefined *)0x0;
        }
        else {
          local_328 = PTR_copy_label_0049cd58;
        }
        local_88 = local_328;
        ensure_size<example>
                  ((v_array<example> *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60)
                   ,(size_t)in_stack_fffffffffffffb58);
        for (local_90 = (action *)0x0; local_90 < in_RDX; local_90 = (action *)((long)local_90 + 1))
        {
          v_array<example>::begin(&in_RDI->learn_ec_copy);
          VW::copy_example_data
                    (SUB41((uint)in_stack_fffffffffffffb64 >> 0x18,0),in_stack_fffffffffffffb58,
                     in_stack_fffffffffffffb50,(size_t)in_stack_fffffffffffffb48,
                     (_func_void_void_ptr_void_ptr *)0x3be7dd);
        }
        ppeVar6 = v_array<example>::begin(&in_RDI->learn_ec_copy);
        in_RDI->learn_ec_ref = *ppeVar6;
      }
      else {
        in_RDI->learn_ec_ref = (example *)in_RSI;
      }
      if ((in_RDI->auto_condition_features & 1U) != 0) {
        ensure_size<unsigned_int>
                  ((v_array<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   (size_t)in_stack_fffffffffffffb58);
        ensure_size<Search::action_repr>
                  ((v_array<Search::action_repr> *)
                   CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   (size_t)in_stack_fffffffffffffb58);
        ppuVar7 = v_array<unsigned_int>::begin(&in_RDI->learn_condition_on);
        puVar8 = *ppuVar7 + (long)local_310;
        ppuVar7 = v_array<unsigned_int>::end(&in_RDI->learn_condition_on);
        *ppuVar7 = puVar8;
        ppuVar7 = v_array<unsigned_int>::begin(&in_RDI->learn_condition_on);
        memcpy(*ppuVar7,in_stack_00000008,(long)local_310 << 2);
        for (local_98 = (example *)0x0; local_98 < local_310;
            local_98 = (example *)((long)&(local_98->super_example_predict).indices._begin + 1)) {
          if ((*(action *)((long)&in_stack_00000008->all + (long)local_98 * 4) == 0) ||
             (uVar1 = *(action *)((long)&in_stack_00000008->all + (long)local_98 * 4),
             sVar9 = v_array<Search::action_repr>::size(&in_RDI->ptag_to_action), sVar9 <= uVar1)) {
            action_repr::action_repr(&local_a8,0);
          }
          else {
            paVar10 = v_array<Search::action_repr>::operator[]
                                (&in_RDI->ptag_to_action,
                                 (ulong)*(action *)
                                         ((long)&in_stack_00000008->all + (long)local_98 * 4));
            local_a8.a = paVar10->a;
            local_a8._4_4_ = *(undefined4 *)&paVar10->field_0x4;
            local_a8.repr = paVar10->repr;
          }
          item.repr = in_stack_fffffffffffffb80;
          item._0_8_ = in_stack_fffffffffffffb78;
          push_at<Search::action_repr>
                    ((v_array<Search::action_repr> *)
                     CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),item,
                     (size_t)in_stack_fffffffffffffb68);
        }
        if (in_stack_00000010 == (action_repr *)0x0) {
          ensure_size<char>((v_array<char> *)
                            CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                            (size_t)in_stack_fffffffffffffb58);
          pcVar11 = v_array<char>::operator[](&in_RDI->learn_condition_on_names,0);
          *pcVar11 = '\0';
        }
        else {
          strlen((char *)in_stack_00000010);
          ensure_size<char>((v_array<char> *)
                            CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                            (size_t)in_stack_fffffffffffffb58);
          ppcVar12 = v_array<char>::begin(&in_RDI->learn_condition_on_names);
          strcpy(*ppcVar12,(char *)in_stack_00000010);
        }
      }
      if ((in_stack_00000018 != (action *)0x0) && (in_stack_00000020 != (action *)0x0)) {
        ensure_size<unsigned_int>
                  ((v_array<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   (size_t)in_stack_fffffffffffffb58);
        ppuVar7 = v_array<unsigned_int>::begin(&in_RDI->learn_allowed_actions);
        memcpy(*ppuVar7,in_stack_00000018,(long)in_stack_00000020 << 2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_c8,"in LEARN, learn_allowed_actions",(allocator *)(local_ec + 0x23));
        cdbg_print_array<unsigned_int>
                  ((string *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   (v_array<unsigned_int> *)in_stack_fffffffffffffb58);
        std::__cxx11::string::~string(local_c8);
        std::allocator<char>::~allocator((allocator<char> *)(local_ec + 0x23));
      }
    }
    *(float *)&(in_stack_00000038->super_example_predict).indices._begin = 0.0;
    if ((in_stack_00000018 == (action *)0x0) || (in_stack_00000020 == (action *)0x0)) {
      local_360 = uVar4;
      if ((in_RDI->is_ldf & 1U) == 0) {
        local_360 = uVar4 + 1;
      }
      local_35c = local_360;
    }
    else {
      local_35c = in_stack_00000018[uVar4];
    }
    local_ec._12_4_ = local_35c;
    if ((in_RDI->metaoverride != (BaseTask *)0x0) &&
       (in_RDI->metaoverride->_foreach_action !=
        (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)) {
      foreach_action_from_cache
                (in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98,
                 in_stack_fffffffffffffb94);
      ppvVar13 = v_array<v_array<Search::action_cache>_*>::operator[]
                           (&in_RDI->memo_foreach_action,i_00);
      if (*ppvVar13 != (v_array<Search::action_cache> *)0x0) {
        ppvVar13 = v_array<v_array<Search::action_cache>_*>::operator[]
                             (&in_RDI->memo_foreach_action,i_00);
        paVar14 = v_array<Search::action_cache>::operator[](*ppvVar13,(ulong)uVar4);
        *(float *)&(in_stack_00000038->super_example_predict).indices._begin = paVar14->cost;
      }
    }
    if (in_RDI->metaoverride == (BaseTask *)0x0) {
      return local_ec._12_4_;
    }
    if (in_RDI->metaoverride->_post_prediction == (_func_void_search_ptr_size_t_action_float *)0x0)
    {
      return local_ec._12_4_;
    }
    (*in_RDI->metaoverride->_post_prediction)
              (in_RDI->metaoverride->sch,i_00 - in_RDI->meta_t,local_ec._12_4_,
               *(float *)&(in_stack_00000038->super_example_predict).indices._begin);
    return local_ec._12_4_;
  }
  if ((((in_RDI->state == LEARN) && (in_RDI->learn_t < i_00)) && (in_RDI->rollout_num_steps != 0))
     && (in_RDI->rollout_num_steps <= in_RDI->loss_declared_cnt)) {
    if ((in_RDI->is_ldf & 1U) == 0) {
      if ((in_stack_00000018 == (action *)0x0) || (in_stack_00000020 == (action *)0x0)) {
        local_368 = 1;
      }
      else {
        local_368 = *in_stack_00000018;
      }
      local_364 = local_368;
    }
    else {
      local_364 = 0;
    }
    local_ec._8_4_ = local_364;
    if ((in_RDI->metaoverride != (BaseTask *)0x0) &&
       (in_RDI->metaoverride->_post_prediction != (_func_void_search_ptr_size_t_action_float *)0x0))
    {
      (*in_RDI->metaoverride->_post_prediction)
                (in_RDI->metaoverride->sch,i_00 - in_RDI->meta_t,local_364,0.0);
    }
    if ((in_RDI->metaoverride != (BaseTask *)0x0) &&
       (in_RDI->metaoverride->_foreach_action !=
        (_func_void_search_ptr_size_t_float_action_bool_float *)0x0)) {
      foreach_action_from_cache
                (in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98,
                 in_stack_fffffffffffffb94);
    }
    *(float *)&(in_stack_00000038->super_example_predict).indices._begin = 0.0;
    return local_ec._8_4_;
  }
  if (((in_RDI->state != INIT_TRAIN) && (in_RDI->state != INIT_TEST)) &&
     ((in_RDI->state != LEARN || (i_00 <= in_RDI->learn_t)))) {
    std::__cxx11::stringstream::stringstream(local_2e0);
    std::operator<<((ostream *)(local_2e0 + 0x10),"error: predict called in unknown state");
    pcVar11 = (char *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              ((vw_exception *)in_stack_fffffffffffffb80,pcVar11,in_stack_fffffffffffffb74,
               (string *)in_stack_fffffffffffffb68);
    __cxa_throw(pcVar11,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  local_ec._4_4_ = choose_policy(in_stack_fffffffffffffd38,(bool)in_stack_fffffffffffffd37);
  local_ec._0_4_ = 0;
  bVar19 = 0;
  if (((in_RDI->state == INIT_TRAIN) && (bVar19 = 0, in_RDI->rollout_method == NO_ROLLOUT)) &&
     (in_stack_fffffffffffffc96 = 1, bVar19 = in_stack_fffffffffffffc96, in_R9 == (example *)0x0)) {
    in_stack_fffffffffffffc96 = in_RDI->use_action_costs;
    bVar19 = in_stack_fffffffffffffc96;
  }
  local_ed = bVar19 & 1;
  *(float *)&(in_stack_00000038->super_example_predict).indices._begin = 0.0;
  local_ee = 0;
  if (((in_RDI->metaoverride != (BaseTask *)0x0) &&
      (in_RDI->metaoverride->_maybe_override_prediction !=
       (_func_bool_search_ptr_size_t_action_ptr_float_ptr *)0x0)) &&
     ((in_RDI->state != LEARN &&
      ((local_ee = (*in_RDI->metaoverride->_maybe_override_prediction)
                             (in_RDI->metaoverride->sch,i_00 - in_RDI->meta_t,(action *)local_ec,
                              (float *)in_stack_00000038), (bool)local_ee &&
       (bVar2 = need_memo_foreach_action(in_RDI), bVar2)))))) {
    local_f8 = 0;
    v_array<v_array<Search::action_cache>_*>::push_back
              ((v_array<v_array<Search::action_cache>_*> *)in_stack_fffffffffffffb50,
               (v_array<Search::action_cache> **)in_stack_fffffffffffffb48);
  }
  if (((local_ee & 1) == 0) && (local_ec._4_4_ == -1)) {
    in_stack_fffffffffffffb48 = in_stack_00000028;
    local_ec._0_4_ =
         choose_oracle_action
                   ((search_private *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                    in_stack_fffffffffffffc78,(action *)in_stack_fffffffffffffc70,
                    CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                    (action *)in_stack_fffffffffffffc60,
                    CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                    (float *)CONCAT17(bVar19,CONCAT16(in_stack_fffffffffffffc96,
                                                      CONCAT15(in_stack_fffffffffffffc95,
                                                               in_stack_fffffffffffffc90))));
  }
  local_f9 = false;
  if ((local_ec._4_4_ == -1) && (local_f9 = false, in_RDI->metaoverride != (BaseTask *)0x0)) {
    local_f9 = in_RDI->metaoverride->_foreach_action !=
               (_func_void_search_ptr_size_t_float_action_bool_float *)0x0;
  }
  if (((-1 < (int)local_ec._4_4_) || ((local_ed & 1) != 0)) || ((bool)local_f9 != false)) {
    local_100 = select_learner(in_RDI,local_ec._4_4_,(size_t)in_stack_00000030,false,
                               in_RDI->state != INIT_TEST);
    ensure_size<Search::action_repr>
              ((v_array<Search::action_repr> *)
               CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
               (size_t)in_stack_fffffffffffffb58);
    for (local_108 = (example *)0x0;
        do_store = (undefined1)((ulong)in_stack_fffffffffffffb88 >> 0x38), local_108 < local_310;
        local_108 = (example *)((long)&(local_108->super_example_predict).indices._begin + 1)) {
      if ((*(action *)((long)&in_stack_00000008->all + (long)local_108 * 4) == 0) ||
         (uVar4 = *(action *)((long)&in_stack_00000008->all + (long)local_108 * 4),
         sVar9 = v_array<Search::action_repr>::size(&in_RDI->ptag_to_action), sVar9 <= uVar4)) {
        action_repr::action_repr(&local_118,0);
      }
      else {
        paVar10 = v_array<Search::action_repr>::operator[]
                            (&in_RDI->ptag_to_action,
                             (ulong)*(action *)((long)&in_stack_00000008->all + (long)local_108 * 4)
                            );
        local_118.a = paVar10->a;
        local_118._4_4_ = *(undefined4 *)&paVar10->field_0x4;
        local_118.repr = paVar10->repr;
      }
      paVar10 = v_array<Search::action_repr>::operator[]
                          (&in_RDI->condition_on_actions,(size_t)local_108);
      paVar10->a = local_118.a;
      *(undefined4 *)&paVar10->field_0x4 = local_118._4_4_;
      paVar10->repr = local_118.repr;
    }
    local_119 = 0;
    if ((in_RDI->all->training & 1U) != 0) {
      local_119 = *(bool *)((long)in_RSI + 0x68c8) ^ 0xff;
    }
    local_119 = local_119 & 1;
    if ((((local_ee & 1) == 0) && ((local_f9 & 1) == 0)) && (local_119 != 0)) {
      in_stack_fffffffffffffc60 = in_RDI;
      in_stack_fffffffffffffc6c = in_ECX;
      in_stack_fffffffffffffc70 = in_stack_00000008;
      v_array<Search::action_repr>::begin(&in_RDI->condition_on_actions);
      in_stack_fffffffffffffb58 = (example *)local_ec;
      in_stack_fffffffffffffb48 =
           (example *)CONCAT44((int)((ulong)in_stack_fffffffffffffb48 >> 0x20),local_ec._4_4_);
      in_stack_fffffffffffffb60 = 0;
      in_stack_fffffffffffffb50 = in_stack_00000030;
      in_stack_fffffffffffffb68 = in_stack_00000038;
      bVar2 = cached_action_store_or_find
                        ((search_private *)
                         CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                         (ptag)(in_stack_fffffffffffffbb0 >> 0x20),in_stack_fffffffffffffba8,
                         (char *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
                         CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                         in_stack_fffffffffffffbd0,(size_t)in_stack_fffffffffffffbd8,
                         in_stack_fffffffffffffbe0,(bool)do_store,(float *)in_stack_fffffffffffffbf0
                        );
      if (bVar2) {
        in_RDI->total_cache_hits = in_RDI->total_cache_hits + 1;
        goto LAB_003bfc16;
      }
    }
    uVar4 = in_stack_fffffffffffffc5c & 0xffffff;
    if ((in_RDI->is_ldf & 1U) != 0) {
      bVar2 = COST_SENSITIVE::ec_is_example_header(in_stack_fffffffffffffb68);
      uVar4 = CONCAT13(bVar2,(int3)uVar4);
    }
    local_128 = (action *)(long)(int)(uint)((char)(uVar4 >> 0x18) != '\0');
    features::clear((features *)in_stack_fffffffffffffb50);
    aVar3 = (action)((ulong)in_stack_fffffffffffffc48 >> 0x20);
    if ((in_RDI->auto_condition_features & 1U) != 0) {
      for (local_130 = local_128; aVar3 = (action)((ulong)in_stack_fffffffffffffc48 >> 0x20),
          local_130 < in_RDX; local_130 = (action *)((long)local_130 + 1)) {
        in_stack_fffffffffffffc50 = in_stack_00000010;
        peVar20 = local_310;
        v_array<Search::action_repr>::begin(&in_RDI->condition_on_actions);
        add_example_conditioning
                  (in_stack_fffffffffffffc70,
                   (example *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                   (size_t)in_stack_fffffffffffffc60,
                   (char *)CONCAT44(uVar4,in_stack_fffffffffffffc58),in_stack_fffffffffffffc50);
        in_stack_fffffffffffffc48 = local_310;
        local_310 = peVar20;
      }
    }
    if ((((local_ee & 1) == 0) && (-1 < (int)local_ec._4_4_)) || ((local_f9 & 1) != 0)) {
      if (((in_RDI->auto_condition_features & 1U) != 0) &&
         (((in_RDI->acset).use_passthrough_repr & 1U) != 0)) {
        if ((in_RDI->is_ldf & 1U) != 0) {
          poVar15 = std::operator<<((ostream *)&std::cerr,
                                    "search cannot use state representations in ldf mode");
          std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
          peVar16 = (exception *)__cxa_allocate_exception(8);
          std::exception::exception(peVar16);
          __cxa_throw(peVar16,&std::exception::typeinfo,std::exception::~exception);
        }
        if (*(features **)((long)in_RSI + 0x68c0) != (features *)0x0) {
          poVar15 = std::operator<<((ostream *)&std::cerr,"search cannot passthrough");
          std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
          peVar16 = (exception *)__cxa_allocate_exception(8);
          std::exception::exception(peVar16);
          __cxa_throw(peVar16,&std::exception::typeinfo,std::exception::~exception);
        }
        *(features **)((long)in_RSI + 0x68c0) = &in_RDI->last_action_repr;
      }
      if ((in_RDI->is_ldf & 1U) == 0) {
        in_stack_fffffffffffffbbc = local_ec._0_4_;
        if ((local_f9 & 1) == 0) {
          in_stack_fffffffffffffbbc = 0xffffffff;
        }
        in_stack_fffffffffffffb50 =
             (example *)
             CONCAT44((int)((ulong)in_stack_fffffffffffffb50 >> 0x20),in_stack_fffffffffffffbbc);
        in_stack_fffffffffffffb48 = in_stack_00000038;
        in_stack_fffffffffffffbc8 = in_RSI;
        in_stack_fffffffffffffbd4 = local_100;
        in_stack_fffffffffffffbd8 = in_stack_00000018;
        in_stack_fffffffffffffbe0 = in_stack_00000020;
        in_stack_fffffffffffffbf0 = in_stack_00000038;
        local_408 = single_prediction_notLDF
                              ((search_private *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffb0),
                               local_310,(int)(i_00 >> 0x20),
                               (action *)
                               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                               (size_t)local_318,
                               (float *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88
                                                ),in_R8,in_stack_ffffffffffffffc8);
        in_stack_fffffffffffffbe8 = in_stack_00000028;
      }
      else {
        in_stack_fffffffffffffc00 = in_RDI;
        in_stack_fffffffffffffc08 = in_RSI;
        local_408 = single_prediction_LDF
                              (in_stack_fffffffffffffc70,
                               (example *)
                               CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                               (size_t)in_stack_fffffffffffffc60,uVar4,
                               (float *)in_stack_fffffffffffffc50,aVar3);
      }
      local_ec._0_4_ = local_408;
      local_138 = 0;
      while (in_stack_fffffffffffffbb0 = local_138, sVar9 = features::size((features *)0x3bf901),
            in_stack_fffffffffffffbb0 < sVar9) {
        local_138 = local_138 + 1;
      }
      *(features **)((long)in_RSI + 0x68c0) = (features *)0x0;
    }
    if ((local_ed & 1) != 0) {
      in_stack_fffffffffffffb50 = (example *)&in_RDI->gte_label;
      allowed_actions_to_label
                ((search_private *)in_stack_fffffffffffffbf0,(size_t)in_stack_fffffffffffffbe8,
                 in_stack_fffffffffffffbe0,(size_t)in_stack_fffffffffffffbd8,
                 (float *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (action *)&in_stack_fffffffffffffbc8->empty,(size_t)in_stack_fffffffffffffc00,
                 in_stack_fffffffffffffc08);
      local_140 = (ptag *)0x0;
      in_stack_fffffffffffffb48 = in_R9;
      while (in_stack_fffffffffffffba8 = local_140,
            ppVar17 = (ptag *)v_array<COST_SENSITIVE::wclass>::size
                                        ((v_array<COST_SENSITIVE::wclass> *)
                                         &(in_RDI->gte_label).simple),
            in_stack_fffffffffffffba8 < ppVar17) {
        local_140 = (ptag *)((long)local_140 + 1);
      }
      in_RDI->learn_ec_ref = (example *)in_RSI;
      in_RDI->learn_ec_ref_cnt = (size_t)in_RDX;
      if (in_stack_00000018 != (action *)0x0) {
        ensure_size<unsigned_int>
                  ((v_array<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                   (size_t)in_stack_fffffffffffffb58);
        ppuVar7 = v_array<unsigned_int>::begin(&in_RDI->learn_allowed_actions);
        memcpy(*ppuVar7,in_stack_00000018,(long)in_stack_00000020 << 2);
      }
      local_148 = in_RDI->learn_learner_id;
      in_RDI->learn_learner_id = (size_t)in_stack_00000030;
      generate_training_example
                (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
                 (bool)in_stack_fffffffffffffd03,in_stack_fffffffffffffcfc);
      in_RDI->learn_learner_id = local_148;
    }
    mytag_00 = (ptag)(in_stack_fffffffffffffbb0 >> 0x20);
    if ((in_RDI->auto_condition_features & 1U) != 0) {
      for (local_150 = local_128; mytag_00 = (ptag)(in_stack_fffffffffffffbb0 >> 0x20),
          local_150 < in_RDX; local_150 = (action *)((long)local_150 + 1)) {
        del_example_conditioning
                  ((search_private *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      }
    }
    if (((local_119 & 1) != 0) && ((local_ee & 1) == 0)) {
      psVar18 = in_RDI;
      v_array<Search::action_repr>::begin(&in_RDI->condition_on_actions);
      in_stack_fffffffffffffb48 =
           (example *)CONCAT44((int)((ulong)in_stack_fffffffffffffb48 >> 0x20),local_ec._4_4_);
      cached_action_store_or_find
                ((search_private *)CONCAT44(in_stack_fffffffffffffbbc,in_stack_fffffffffffffbb8),
                 mytag_00,in_stack_fffffffffffffba8,(char *)in_stack_00000010,
                 (action_repr *)in_stack_00000008,CONCAT44(in_ECX,in_stack_fffffffffffffb90),
                 in_stack_fffffffffffffbd0,(size_t)in_stack_fffffffffffffbd8,
                 in_stack_fffffffffffffbe0,SUB81((ulong)psVar18 >> 0x38,0),
                 (float *)in_stack_fffffffffffffbf0);
      in_stack_fffffffffffffb50 = in_stack_00000030;
    }
  }
LAB_003bfc16:
  if (in_RDI->state == INIT_TRAIN) {
    scored_action::scored_action
              (&local_158,local_ec._0_4_,
               *(float *)&(in_stack_00000038->super_example_predict).indices._begin);
    v_array<Search::scored_action>::push_back
              ((v_array<Search::scored_action> *)in_stack_fffffffffffffb50,
               (scored_action *)in_stack_fffffffffffffb48);
  }
  if ((in_RDI->metaoverride != (BaseTask *)0x0) &&
     (in_RDI->metaoverride->_post_prediction != (_func_void_search_ptr_size_t_action_float *)0x0)) {
    (*in_RDI->metaoverride->_post_prediction)
              (in_RDI->metaoverride->sch,i_00 - in_RDI->meta_t,local_ec._0_4_,
               *(float *)&(in_stack_00000038->super_example_predict).indices._begin);
  }
  return local_ec._0_4_;
}

Assistant:

action search_predict(search_private& priv, example* ecs, size_t ec_cnt, ptag mytag, const action* oracle_actions,
    size_t oracle_actions_cnt, const ptag* condition_on, const char* condition_on_names, const action* allowed_actions,
    size_t allowed_actions_cnt, const float* allowed_actions_cost, size_t learner_id, float& a_cost, float /* weight */)
{
  size_t condition_on_cnt = condition_on_names ? strlen(condition_on_names) : 0;
  size_t t = priv.t + priv.meta_t;
  priv.t++;

  // make sure parameters come in pairs correctly
  assert((oracle_actions == nullptr) == (oracle_actions_cnt == 0));
  assert((condition_on == nullptr) == (condition_on_names == nullptr));
  assert(((allowed_actions == nullptr) && (allowed_actions_cost == nullptr)) == (allowed_actions_cnt == 0));
  assert(priv.use_action_costs == (allowed_actions_cost != nullptr));
  if (allowed_actions_cost != nullptr)
    assert(oracle_actions == nullptr);

  // if we're just after the string, choose an oracle action
  if ((priv.state == GET_TRUTH_STRING) || priv.force_oracle)
  {
    action a = choose_oracle_action(
        priv, ec_cnt, oracle_actions, oracle_actions_cnt, allowed_actions, allowed_actions_cnt, allowed_actions_cost);
    // if (priv.metaoverride && priv.metaoverride->_post_prediction)
    //  priv.metaoverride->_post_prediction(*priv.metaoverride->sch, t-priv.meta_t, a, 0.);
    a_cost = 0.;
    return a;
  }

  // if we're in LEARN mode and before learn_t, return the train action
  if ((priv.state == LEARN) && (t < priv.learn_t))
  {
    assert(t < priv.train_trajectory.size());
    action a = priv.train_trajectory[t].a;
    a_cost = priv.train_trajectory[t].s;
    cdbg << "LEARN " << t << " < priv.learn_t ==> a=" << a << ", a_cost=" << a_cost << endl;
    if (priv.metaoverride && priv.metaoverride->_foreach_action)
      foreach_action_from_cache(priv, t);
    if (priv.metaoverride && priv.metaoverride->_post_prediction)
      priv.metaoverride->_post_prediction(*priv.metaoverride->sch, t - priv.meta_t, a, a_cost);
    return a;
  }

  // for LDF, # of valid actions is ec_cnt; otherwise it's either allowed_actions_cnt or A
  size_t valid_action_cnt = priv.is_ldf ? ec_cnt : (allowed_actions_cnt > 0) ? allowed_actions_cnt : priv.A;

  // if we're in LEARN mode and _at_ learn_t, then:
  //   - choose the next action
  //   - decide if we're done
  //   - if we are, then copy/mark the example ref
  if ((priv.state == LEARN) && (t == priv.learn_t))
  {
    action a = (action)priv.learn_a_idx;
    priv.loss_declared_cnt = 0;

    cdbg << "LEARN " << t << " = priv.learn_t ==> a=" << a << ", learn_a_idx=" << priv.learn_a_idx
         << " valid_action_cnt=" << valid_action_cnt << endl;
    priv.learn_a_idx++;

    // check to see if we're done with available actions
    if (priv.learn_a_idx >= valid_action_cnt)
    {
      priv.done_with_all_actions = true;
      priv.learn_learner_id = learner_id;

      // set reference or copy example(s)
      if (oracle_actions_cnt > 0)
        priv.learn_oracle_action = oracle_actions[0];
      priv.learn_ec_ref_cnt = ec_cnt;
      if (priv.examples_dont_change)
        priv.learn_ec_ref = ecs;
      else
      {
        size_t label_size = priv.is_ldf ? sizeof(CS::label) : sizeof(MC::label_t);
        void (*label_copy_fn)(void*, void*) = priv.is_ldf ? CS::cs_label.copy_label : nullptr;

        ensure_size(priv.learn_ec_copy, ec_cnt);
        for (size_t i = 0; i < ec_cnt; i++)
          VW::copy_example_data(priv.all->audit, priv.learn_ec_copy.begin() + i, ecs + i, label_size, label_copy_fn);

        priv.learn_ec_ref = priv.learn_ec_copy.begin();
      }

      // copy conditioning stuff and allowed actions
      if (priv.auto_condition_features)
      {
        ensure_size(priv.learn_condition_on, condition_on_cnt);
        ensure_size(priv.learn_condition_on_act, condition_on_cnt);

        priv.learn_condition_on.end() =
            priv.learn_condition_on.begin() + condition_on_cnt;  // allow .size() to be used in lieu of _cnt

        memcpy(priv.learn_condition_on.begin(), condition_on, condition_on_cnt * sizeof(ptag));

        for (size_t i = 0; i < condition_on_cnt; i++)
          push_at(priv.learn_condition_on_act,
              action_repr(((1 <= condition_on[i]) && (condition_on[i] < priv.ptag_to_action.size()))
                      ? priv.ptag_to_action[condition_on[i]]
                      : 0),
              i);

        if (condition_on_names == nullptr)
        {
          ensure_size(priv.learn_condition_on_names, 1);
          priv.learn_condition_on_names[0] = 0;
        }
        else
        {
          ensure_size(priv.learn_condition_on_names, strlen(condition_on_names) + 1);
          strcpy(priv.learn_condition_on_names.begin(), condition_on_names);
        }
      }

      if (allowed_actions && (allowed_actions_cnt > 0))
      {
        ensure_size(priv.learn_allowed_actions, allowed_actions_cnt);
        memcpy(priv.learn_allowed_actions.begin(), allowed_actions, allowed_actions_cnt * sizeof(action));
        cdbg_print_array("in LEARN, learn_allowed_actions", priv.learn_allowed_actions);
      }
    }

    assert((allowed_actions_cnt == 0) || (a < allowed_actions_cnt));

    a_cost = 0.;
    action a_name = (allowed_actions && (allowed_actions_cnt > 0)) ? allowed_actions[a] : priv.is_ldf ? a : (a + 1);
    if (priv.metaoverride && priv.metaoverride->_foreach_action)
    {
      foreach_action_from_cache(priv, t, a_name);
      if (priv.memo_foreach_action[t])
      {
        cdbg << "@ memo_foreach_action: t=" << t << ", a=" << a << ", cost=" << (*priv.memo_foreach_action[t])[a].cost
             << endl;
        a_cost = (*priv.memo_foreach_action[t])[a].cost;
      }
    }

    a = a_name;

    if (priv.metaoverride && priv.metaoverride->_post_prediction)
      priv.metaoverride->_post_prediction(*priv.metaoverride->sch, t - priv.meta_t, a, a_cost);
    return a;
  }

  if ((priv.state == LEARN) && (t > priv.learn_t) && (priv.rollout_num_steps > 0) &&
      (priv.loss_declared_cnt >= priv.rollout_num_steps))
  {
    cdbg << "... skipping" << endl;
    action a = priv.is_ldf ? 0 : ((allowed_actions && (allowed_actions_cnt > 0)) ? allowed_actions[0] : 1);
    if (priv.metaoverride && priv.metaoverride->_post_prediction)
      priv.metaoverride->_post_prediction(*priv.metaoverride->sch, t - priv.meta_t, a, 0.);
    if (priv.metaoverride && priv.metaoverride->_foreach_action)
      foreach_action_from_cache(priv, t);
    a_cost = 0.;
    return a;
  }

  if ((priv.state == INIT_TRAIN) || (priv.state == INIT_TEST) || ((priv.state == LEARN) && (t > priv.learn_t)))
  {
    // we actually need to run the policy

    int policy = choose_policy(priv);
    action a = 0;

    cdbg << "executing policy " << policy << endl;

    bool gte_here = (priv.state == INIT_TRAIN) && (priv.rollout_method == NO_ROLLOUT) &&
        ((oracle_actions_cnt > 0) || (priv.use_action_costs));
    a_cost = 0.;
    bool skip = false;

    if (priv.metaoverride && priv.metaoverride->_maybe_override_prediction &&
        (priv.state != LEARN))  // if LEARN and t>learn_t,then we cannot allow overrides!
    {
      skip = priv.metaoverride->_maybe_override_prediction(*priv.metaoverride->sch, t - priv.meta_t, a, a_cost);
      cdbg << "maybe_override_prediction --> " << skip << ", a=" << a << ", a_cost=" << a_cost << endl;
      if (skip && need_memo_foreach_action(priv))
        priv.memo_foreach_action.push_back(nullptr);
    }

    if ((!skip) && (policy == -1))
      a = choose_oracle_action(priv, ec_cnt, oracle_actions, oracle_actions_cnt, allowed_actions, allowed_actions_cnt,
          allowed_actions_cost);  // TODO: we probably want to actually get costs for oracle actions???

    bool need_fea = (policy == -1) && priv.metaoverride && priv.metaoverride->_foreach_action;

    if ((policy >= 0) || gte_here || need_fea)  // the last case is we need to do foreach action
    {
      int learner = select_learner(priv, policy, learner_id, false, priv.state != INIT_TEST);

      ensure_size(priv.condition_on_actions, condition_on_cnt);
      for (size_t i = 0; i < condition_on_cnt; i++)
        priv.condition_on_actions[i] = ((1 <= condition_on[i]) && (condition_on[i] < priv.ptag_to_action.size()))
            ? priv.ptag_to_action[condition_on[i]]
            : 0;

      bool not_test = priv.all->training && !ecs[0].test_only;

      if ((!skip) && (!need_fea) && not_test &&
          cached_action_store_or_find(priv, mytag, condition_on, condition_on_names, priv.condition_on_actions.begin(),
              condition_on_cnt, policy, learner_id, a, false, a_cost))
        // if this succeeded, 'a' has the right action
        priv.total_cache_hits++;
      else  // we need to predict, and then cache, and maybe run foreach_action
      {
        size_t start_K = (priv.is_ldf && COST_SENSITIVE::ec_is_example_header(ecs[0])) ? 1 : 0;
        priv.last_action_repr.clear();
        if (priv.auto_condition_features)
          for (size_t n = start_K; n < ec_cnt; n++)
            add_example_conditioning(
                priv, ecs[n], condition_on_cnt, condition_on_names, priv.condition_on_actions.begin());

        if (((!skip) && (policy >= 0)) || need_fea)  // only make a prediction if we're going to use the output
        {
          if (priv.auto_condition_features && priv.acset.use_passthrough_repr)
          {
            if (priv.is_ldf)
            {
              std::cerr << "search cannot use state representations in ldf mode" << endl;
              throw exception();
            }
            if (ecs[0].passthrough)
            {
              std::cerr << "search cannot passthrough" << endl;
              throw exception();
            }
            ecs[0].passthrough = &priv.last_action_repr;
          }
          a = priv.is_ldf ? single_prediction_LDF(priv, ecs, ec_cnt, learner, a_cost, need_fea ? a : (action)-1)
                          : single_prediction_notLDF(priv, *ecs, learner, allowed_actions, allowed_actions_cnt,
                                allowed_actions_cost, a_cost, need_fea ? a : (action)-1);

          cdbg << "passthrough = [";
          for (size_t kk = 0; kk < priv.last_action_repr.size(); kk++)
            cdbg << ' ' << priv.last_action_repr.indicies[kk] << ':' << priv.last_action_repr.values[kk];
          cdbg << " ]" << endl;

          ecs[0].passthrough = nullptr;
        }

        if (need_fea)
        {
          // TODO this
        }

        if (gte_here)
        {
          cdbg << "INIT_TRAIN, NO_ROLLOUT, at least one oracle_actions, a=" << a << endl;
          // we can generate a training example _NOW_ because we're not doing rollouts
          // allowed_actions_to_losses(priv, ec_cnt, allowed_actions, allowed_actions_cnt, oracle_actions,
          // oracle_actions_cnt, losses);
          allowed_actions_to_label(priv, ec_cnt, allowed_actions, allowed_actions_cnt, allowed_actions_cost,
              oracle_actions, oracle_actions_cnt, priv.gte_label);
          cdbg << "priv.gte_label = [";
          for (size_t i = 0; i < priv.gte_label.cs.costs.size(); i++)
            cdbg << ' ' << priv.gte_label.cs.costs[i].class_index << ':' << priv.gte_label.cs.costs[i].x;
          cdbg << " ]" << endl;

          priv.learn_ec_ref = ecs;
          priv.learn_ec_ref_cnt = ec_cnt;
          if (allowed_actions)
          {
            ensure_size(priv.learn_allowed_actions, allowed_actions_cnt);  // TODO: do we really need this?
            memcpy(priv.learn_allowed_actions.begin(), allowed_actions, allowed_actions_cnt * sizeof(action));
          }
          size_t old_learner_id = priv.learn_learner_id;
          priv.learn_learner_id = learner_id;
          generate_training_example(
              priv, priv.gte_label, 1., false);  // this is false because the conditioning has already been added!
          priv.learn_learner_id = old_learner_id;
        }

        if (priv.auto_condition_features)
          for (size_t n = start_K; n < ec_cnt; n++) del_example_conditioning(priv, ecs[n]);

        if (not_test && (!skip))
          cached_action_store_or_find(priv, mytag, condition_on, condition_on_names, priv.condition_on_actions.begin(),
              condition_on_cnt, policy, learner_id, a, true, a_cost);
      }
    }

    if (priv.state == INIT_TRAIN)
      priv.train_trajectory.push_back(scored_action(a, a_cost));  // note the action for future reference

    if (priv.metaoverride && priv.metaoverride->_post_prediction)
      priv.metaoverride->_post_prediction(*priv.metaoverride->sch, t - priv.meta_t, a, a_cost);

    return a;
  }

  THROW("error: predict called in unknown state");
}